

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

bool __thiscall OpenMD::RigidBody::getAtomRefCoor(RigidBody *this,Vector3d *coor,uint index)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)index;
  uVar1 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 < uVar1) {
    Vector<double,_3U>::operator=
              (&coor->super_Vector<double,_3U>,
               &(this->refCoords_).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2].super_Vector<double,_3U>);
  }
  else {
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)index,uVar1);
    painCave.isFatal = 0;
    simError();
  }
  return uVar2 < uVar1;
}

Assistant:

bool RigidBody::getAtomRefCoor(Vector3d& coor, unsigned int index) {
    if (index < atoms_.size()) {
      coor = refCoords_[index];
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }